

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http.c++
# Opt level: O2

HttpClient * __thiscall
kj::anon_unknown_36::NetworkHttpClient::getClient(NetworkHttpClient *this,Url *parsed)

{
  size_t sVar1;
  Detail *pDVar2;
  long lVar3;
  _Base_ptr p_Var4;
  Vector<kj::StringPtr> *pVVar5;
  PromiseForResult<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_kj_compat_http_c__:6418:17),_kj::Own<kj::NetworkAddress>_>
  PVar6;
  Maybe<kj::EntropySource_&> MVar7;
  bool bVar8;
  bool bVar9;
  _Base_ptr *pp_Var10;
  void *pvVar11;
  PromiseNetworkAddressHttpClient *pPVar12;
  _Rb_tree_node_base *this_00;
  _Rb_tree_node_base *p_Var13;
  char *pcVar14;
  _Base_ptr *pp_Var15;
  char cVar16;
  Maybe<kj::Network_&> MVar17;
  _Link_type __p;
  undefined8 uVar18;
  _Link_type other;
  PromiseBase location;
  SimpleTransformPromiseNode<kj::Own<kj::(anonymous_namespace)::NetworkAddressHttpClient,_std::nullptr_t>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_kj_compat_http_c__:6184:30)>
  *location_00;
  _Rb_tree_node_base *p_Var19;
  Fault f_1;
  Own<kj::_::PromiseNode,_kj::_::PromiseDisposer> local_e0;
  _Rb_tree_node_base *local_d8;
  PromiseForResult<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_kj_compat_http_c__:6418:17),_kj::Own<kj::NetworkAddress>_>
  promise;
  PromiseBase local_c8;
  Fault f;
  Host local_b0;
  Maybe<kj::EntropySource_&> local_88;
  iterator local_80;
  bool _kjCondition;
  undefined7 uStack_77;
  Maybe<kj::WebSocketErrorHandler_&> MStack_70;
  Maybe<kj::SecureNetworkWrapper_&> local_68;
  _Base_ptr p_Stack_60;
  PromiseNetworkAddressHttpClient *local_58;
  Own<kj::_::PromiseNode,_kj::_::PromiseDisposer> local_50;
  char local_48;
  anon_class_8_1_8991fb9c_for_func local_40;
  String *local_38;
  
  f.exception = (Exception *)anon_var_dwarf_a34709;
  bVar8 = String::operator==(&parsed->scheme,(StringPtr *)&f);
  f.exception = (Exception *)anon_var_dwarf_a34715;
  bVar9 = String::operator==(&parsed->scheme,(StringPtr *)&f);
  _kjCondition = bVar9 || bVar8;
  if (!bVar9 && !bVar8) {
    kj::_::Debug::Fault::Fault<kj::Exception::Type,bool&>
              (&f,
               "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/compat/http.c++"
               ,0x18fc,FAILED,"isHttp || isHttps","_kjCondition,",&_kjCondition);
    kj::_::Debug::Fault::fatal(&f);
  }
  local_80._M_node = (_Base_ptr)&this->httpHosts;
  if (bVar8) {
    local_80._M_node = (_Base_ptr)&this->httpsHosts;
  }
  if ((parsed->host).content.size_ == 0) {
    f.exception = (Exception *)0x4706a1;
  }
  else {
    f.exception = (Exception *)(parsed->host).content.ptr;
  }
  local_38 = &parsed->host;
  p_Var13 = (_Rb_tree_node_base *)&(local_80._M_node)->_M_parent;
  pp_Var15 = &(local_80._M_node)->_M_left;
  pp_Var10 = pp_Var15;
  local_d8 = p_Var13;
  local_88.ptr = (EntropySource *)this;
  while (p_Var19 = *pp_Var10, p_Var19 != (_Rb_tree_node_base *)0x0) {
    bVar9 = ArrayPtr<const_char>::operator<
                      ((ArrayPtr<const_char> *)(p_Var19 + 1),(ArrayPtr<const_char> *)&f);
    if (!bVar9) {
      p_Var13 = p_Var19;
    }
    pp_Var10 = &p_Var19->_M_left + bVar9;
  }
  if (p_Var13 != local_d8) {
    bVar9 = ArrayPtr<const_char>::operator<
                      ((ArrayPtr<const_char> *)&f,(ArrayPtr<const_char> *)(p_Var13 + 1));
    if (!bVar9) goto LAB_00381829;
  }
  MVar7.ptr = local_88.ptr;
  if (bVar8) {
    MVar17.ptr = *(Network **)(local_88.ptr + 0x28);
    uVar18 = 0x1bb;
    if (MVar17.ptr == (Network *)0x0) {
      kj::_::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[38]>
                (&f,
                 "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/compat/http.c++"
                 ,0x190e,FAILED,"tlsNetwork != nullptr","\"this HttpClient doesn\'t support HTTPS\""
                 ,(char (*) [38])"this HttpClient doesn\'t support HTTPS");
      kj::_::Debug::Fault::fatal(&f);
    }
  }
  else {
    MVar17.ptr = *(Network **)(local_88.ptr + 0x20);
    uVar18 = 0x50;
  }
  sVar1 = (parsed->host).content.size_;
  if (sVar1 == 0) {
    pcVar14 = "";
  }
  else {
    pcVar14 = (parsed->host).content.ptr;
  }
  (**(MVar17.ptr)->_vptr_Network)(&f_1,MVar17.ptr,pcVar14,sVar1 + (sVar1 == 0),uVar18);
  local_e0.ptr = (PromiseNode *)MVar7.ptr;
  f.exception = (Exception *)
                kj::_::
                SimpleTransformPromiseNode<kj::Own<kj::NetworkAddress,_std::nullptr_t>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/compat/http.c++:6418:17)>
                ::anon_class_8_1_8991fb9c_for_func::operator();
  pDVar2 = (Detail *)((f_1.exception)->ownFile).content.size_;
  if (pDVar2 == (Detail *)0x0 || (ulong)((long)f_1.exception - (long)pDVar2) < 0x28) {
    pvVar11 = operator_new(0x400);
    location.node.ptr = (OwnPromiseNode)((long)pvVar11 + 0x3d8);
    ctor<kj::_::SimpleTransformPromiseNode<kj::Own<kj::NetworkAddress,decltype(nullptr)>,kj::(anonymous_namespace)::NetworkHttpClient::getClient(kj::Url&)::_lambda(kj::Own<kj::NetworkAddress,decltype(nullptr)>)_1_>,kj::Own<kj::_::PromiseNode,kj::_::PromiseDisposer>,kj::(anonymous_namespace)::NetworkHttpClient::getClient(kj::Url&)::_lambda(kj::Own<kj::NetworkAddress,decltype(nullptr)>)_1_,void*&>
              ((SimpleTransformPromiseNode<kj::Own<kj::NetworkAddress,_std::nullptr_t>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_kj_compat_http_c__:6418:17)>
                *)location.node.ptr,(Own<kj::_::PromiseNode,_kj::_::PromiseDisposer> *)&f_1,
               (anon_class_8_1_8991fb9c_for_func *)&local_e0,&f.exception);
    *(void **)((long)pvVar11 + 0x3e0) = pvVar11;
  }
  else {
    ((f_1.exception)->ownFile).content.size_ = 0;
    location.node.ptr = (OwnPromiseNode)&f_1.exception[-1].traceCount;
    ctor<kj::_::SimpleTransformPromiseNode<kj::Own<kj::NetworkAddress,decltype(nullptr)>,kj::(anonymous_namespace)::NetworkHttpClient::getClient(kj::Url&)::_lambda(kj::Own<kj::NetworkAddress,decltype(nullptr)>)_1_>,kj::Own<kj::_::PromiseNode,kj::_::PromiseDisposer>,kj::(anonymous_namespace)::NetworkHttpClient::getClient(kj::Url&)::_lambda(kj::Own<kj::NetworkAddress,decltype(nullptr)>)_1_,void*&>
              ((SimpleTransformPromiseNode<kj::Own<kj::NetworkAddress,_std::nullptr_t>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_kj_compat_http_c__:6418:17)>
                *)location.node.ptr,(Own<kj::_::PromiseNode,_kj::_::PromiseDisposer> *)&f_1,
               (anon_class_8_1_8991fb9c_for_func *)&local_e0,&f.exception);
    f_1.exception[-1].details.builder.ptr = pDVar2;
  }
  __kjCondition = (PromiseNode *)0x0;
  local_50.ptr = (PromiseNode *)0x0;
  promise.super_PromiseBase.node.ptr = (PromiseBase)(PromiseBase)location.node.ptr;
  Own<kj::_::PromiseNode,_kj::_::PromiseDisposer>::dispose(&local_50);
  Own<kj::_::PromiseNode,_kj::_::PromiseDisposer>::dispose
            ((Own<kj::_::PromiseNode,_kj::_::PromiseDisposer> *)&_kjCondition);
  Own<kj::_::PromiseNode,_kj::_::PromiseDisposer>::dispose
            ((Own<kj::_::PromiseNode,_kj::_::PromiseDisposer> *)&f_1);
  __kjCondition = (PromiseNode *)(parsed->host).content.ptr;
  MStack_70.ptr = (WebSocketErrorHandler *)(parsed->host).content.size_;
  local_68.ptr = (SecureNetworkWrapper *)(parsed->host).content.disposer;
  (local_38->content).ptr = (char *)0x0;
  (local_38->content).size_ = 0;
  pPVar12 = (PromiseNetworkAddressHttpClient *)operator_new(0x30);
  PVar6 = promise;
  local_c8.node.ptr = (OwnPromiseNode)(OwnPromiseNode)promise.super_PromiseBase.node.ptr;
  promise.super_PromiseBase.node.ptr = (PromiseBase)(OwnPromiseNode)0x0;
  (pPVar12->super_HttpClient)._vptr_HttpClient = (_func_int **)&PTR_request_0066eab0;
  f.exception = (Exception *)
                kj::_::
                SimpleTransformPromiseNode<kj::Own<kj::(anonymous_namespace)::NetworkAddressHttpClient,_std::nullptr_t>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/compat/http.c++:6184:30)>
                ::anon_class_8_1_8991fb9c_for_func::operator();
  lVar3 = *(long *)((long)PVar6.super_PromiseBase.node.ptr + 8);
  local_40.this = pPVar12;
  if (lVar3 == 0 || (ulong)((long)PVar6.super_PromiseBase.node.ptr - lVar3) < 0x28) {
    pvVar11 = operator_new(0x400);
    location_00 = (SimpleTransformPromiseNode<kj::Own<kj::(anonymous_namespace)::NetworkAddressHttpClient,_std::nullptr_t>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_kj_compat_http_c__:6184:30)>
                   *)((long)pvVar11 + 0x3d8);
    ctor<kj::_::SimpleTransformPromiseNode<kj::Own<kj::(anonymous_namespace)::NetworkAddressHttpClient,decltype(nullptr)>,kj::(anonymous_namespace)::PromiseNetworkAddressHttpClient::PromiseNetworkAddressHttpClient(kj::Promise<kj::Own<kj::(anonymous_namespace)::NetworkAddressHttpClient,decltype(nullptr)>>)::_lambda(kj::Own<kj::(anonymous_namespace)::NetworkAddressHttpClient,decltype(nullptr)>&&)_1_>,kj::Own<kj::_::PromiseNode,kj::_::PromiseDisposer>,kj::(anonymous_namespace)::PromiseNetworkAddressHttpClient::PromiseNetworkAddressHttpClient(kj::Promise<kj::Own<kj::(anonymous_namespace)::NetworkAddressHttpClient,decltype(nullptr)>>)::_lambda(kj::Own<kj::(anonymous_namespace)::NetworkAddressHttpClient,decltype(nullptr)>&&)_1_,void*&>
              (location_00,&local_c8.node,&stack0xffffffffffffffc0,&f.exception);
    *(void **)((long)pvVar11 + 0x3e0) = pvVar11;
  }
  else {
    *(undefined8 *)((long)PVar6.super_PromiseBase.node.ptr + 8) = 0;
    location_00 = (SimpleTransformPromiseNode<kj::Own<kj::(anonymous_namespace)::NetworkAddressHttpClient,_std::nullptr_t>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_kj_compat_http_c__:6184:30)>
                   *)((long)PVar6.super_PromiseBase.node.ptr + -0x28);
    ctor<kj::_::SimpleTransformPromiseNode<kj::Own<kj::(anonymous_namespace)::NetworkAddressHttpClient,decltype(nullptr)>,kj::(anonymous_namespace)::PromiseNetworkAddressHttpClient::PromiseNetworkAddressHttpClient(kj::Promise<kj::Own<kj::(anonymous_namespace)::NetworkAddressHttpClient,decltype(nullptr)>>)::_lambda(kj::Own<kj::(anonymous_namespace)::NetworkAddressHttpClient,decltype(nullptr)>&&)_1_>,kj::Own<kj::_::PromiseNode,kj::_::PromiseDisposer>,kj::(anonymous_namespace)::PromiseNetworkAddressHttpClient::PromiseNetworkAddressHttpClient(kj::Promise<kj::Own<kj::(anonymous_namespace)::NetworkAddressHttpClient,decltype(nullptr)>>)::_lambda(kj::Own<kj::(anonymous_namespace)::NetworkAddressHttpClient,decltype(nullptr)>&&)_1_,void*&>
              (location_00,&local_c8.node,&stack0xffffffffffffffc0,&f.exception);
    *(long *)((long)PVar6.super_PromiseBase.node.ptr + -0x20) = lVar3;
  }
  local_50.ptr = (PromiseNode *)0x0;
  f_1.exception = (Exception *)0x0;
  local_e0.ptr = (PromiseNode *)location_00;
  Own<kj::_::PromiseNode,_kj::_::PromiseDisposer>::dispose
            ((Own<kj::_::PromiseNode,_kj::_::PromiseDisposer> *)&f_1);
  Own<kj::_::PromiseNode,_kj::_::PromiseDisposer>::dispose(&local_50);
  f.exception = (Exception *)anon_var_dwarf_9a3139;
  local_b0.name.content.ptr = (char *)0x1100001828;
  Promise<void>::fork((Promise<void> *)&pPVar12->promise);
  Own<kj::_::PromiseNode,_kj::_::PromiseDisposer>::dispose(&local_e0);
  (pPVar12->client).ptr.disposer = (Disposer *)0x0;
  (pPVar12->client).ptr.ptr = (NetworkAddressHttpClient *)0x0;
  pPVar12->failed = false;
  p_Stack_60 = (_Base_ptr)
               &kj::_::HeapDisposer<kj::(anonymous_namespace)::PromiseNetworkAddressHttpClient>::
                instance;
  local_58 = pPVar12;
  Own<kj::_::PromiseNode,_kj::_::PromiseDisposer>::dispose(&local_c8.node);
  f.exception = (Exception *)0x4706a1;
  if ((HttpHeaderTable *)MStack_70.ptr != (HttpHeaderTable *)0x0) {
    f.exception = (Exception *)__kjCondition;
  }
  bVar8 = (HttpHeaderTable *)MStack_70.ptr == (HttpHeaderTable *)0x0;
  pVVar5 = (Vector<kj::StringPtr> *)&(MStack_70.ptr)->_vptr_WebSocketErrorHandler;
  local_b0.name.content.ptr = (char *)__kjCondition;
  local_b0.name.content.size_ = (size_t)MStack_70.ptr;
  __kjCondition = (PromiseNode *)0x0;
  MStack_70.ptr = (WebSocketErrorHandler *)0x0;
  local_b0.name.content.disposer = (ArrayDisposer *)local_68.ptr;
  local_b0.client.disposer = (Disposer *)p_Stack_60;
  local_b0.client.ptr = local_58;
  local_58 = (PromiseNetworkAddressHttpClient *)0x0;
  this_00 = (_Rb_tree_node_base *)operator_new(0x58);
  pPVar12 = local_b0.client.ptr;
  other = (_Link_type)(this_00 + 1);
  *(Exception **)(this_00 + 1) = f.exception;
  this_00[1]._M_parent = (_Base_ptr)((long)&(pVVar5->builder).ptr + (ulong)bVar8);
  this_00[1]._M_left = (_Base_ptr)local_b0.name.content.ptr;
  this_00[1]._M_right = (_Base_ptr)local_b0.name.content.size_;
  local_b0.name.content.ptr = (char *)0x0;
  local_b0.name.content.size_ = 0;
  local_b0.client.ptr = (PromiseNetworkAddressHttpClient *)0x0;
  *(ArrayDisposer **)(this_00 + 2) = local_b0.name.content.disposer;
  this_00[2]._M_parent = (_Base_ptr)local_b0.client.disposer;
  this_00[2]._M_left = (_Base_ptr)pPVar12;
  bVar8 = true;
  p_Var19 = local_d8;
  while (p_Var4 = *pp_Var15, p_Var4 != (_Base_ptr)0x0) {
    bVar8 = ArrayPtr<const_char>::operator<
                      ((ArrayPtr<const_char> *)other,(ArrayPtr<const_char> *)(p_Var4 + 1));
    p_Var19 = p_Var4;
    pp_Var15 = &p_Var4->_M_left + !bVar8;
  }
  p_Var13 = p_Var19;
  if (bVar8 == false) {
LAB_0038174e:
    __p = other;
    bVar8 = ArrayPtr<const_char>::operator<
                      ((ArrayPtr<const_char> *)(p_Var13 + 1),(ArrayPtr<const_char> *)other);
    if (bVar8) goto LAB_0038175e;
    std::
    _Rb_tree<kj::StringPtr,_std::pair<const_kj::StringPtr,_kj::(anonymous_namespace)::NetworkHttpClient::Host>,_std::_Select1st<std::pair<const_kj::StringPtr,_kj::(anonymous_namespace)::NetworkHttpClient::Host>_>,_std::less<kj::StringPtr>,_std::allocator<std::pair<const_kj::StringPtr,_kj::(anonymous_namespace)::NetworkHttpClient::Host>_>_>
    ::_M_drop_node((_Rb_tree<kj::StringPtr,_std::pair<const_kj::StringPtr,_kj::(anonymous_namespace)::NetworkHttpClient::Host>,_std::_Select1st<std::pair<const_kj::StringPtr,_kj::(anonymous_namespace)::NetworkHttpClient::Host>_>,_std::less<kj::StringPtr>,_std::allocator<std::pair<const_kj::StringPtr,_kj::(anonymous_namespace)::NetworkHttpClient::Host>_>_>
                    *)this_00,__p);
    cVar16 = '\0';
  }
  else {
    if (p_Var19 != *(_Base_ptr *)((long)local_80._M_node + 0x18)) {
      p_Var13 = (_Rb_tree_node_base *)std::_Rb_tree_decrement(p_Var19);
      goto LAB_0038174e;
    }
LAB_0038175e:
    cVar16 = '\x01';
    bVar8 = true;
    if (local_d8 != p_Var19) {
      bVar8 = ArrayPtr<const_char>::operator<
                        ((ArrayPtr<const_char> *)other,(ArrayPtr<const_char> *)(p_Var19 + 1));
    }
    std::_Rb_tree_insert_and_rebalance(bVar8,this_00,p_Var19,local_d8);
    *(_Base_ptr *)((long)local_80._M_node + 0x28) =
         (_Base_ptr)((long)&(*(_Base_ptr *)((long)local_80._M_node + 0x28))->_M_color + 1);
    p_Var13 = this_00;
  }
  local_50.ptr = (PromiseNode *)p_Var13;
  local_48 = cVar16;
  Host::~Host(&local_b0);
  MVar7.ptr = local_88.ptr;
  f.exception = (Exception *)&stack0xffffffffffffffb8;
  if (cVar16 == '\0') {
    kj::_::Debug::Fault::Fault<kj::Exception::Type,kj::_::DebugExpression<bool&>&>
              (&f_1,
               "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/compat/http.c++"
               ,0x191e,FAILED,"insertResult.second","_kjCondition,",(DebugExpression<bool_&> *)&f);
    kj::_::Debug::Fault::fatal(&f_1);
  }
  handleCleanup((NetworkHttpClient *)&f,
                (map<kj::StringPtr,_kj::(anonymous_namespace)::NetworkHttpClient::Host,_std::less<kj::StringPtr>,_std::allocator<std::pair<const_kj::StringPtr,_kj::(anonymous_namespace)::NetworkHttpClient::Host>_>_>
                 *)local_88.ptr,local_80);
  TaskSet::add((TaskSet *)(MVar7.ptr + 0xc0),(Promise<void> *)&f);
  Own<kj::_::PromiseNode,_kj::_::PromiseDisposer>::dispose
            ((Own<kj::_::PromiseNode,_kj::_::PromiseDisposer> *)&f);
  Host::~Host((Host *)&_kjCondition);
  Own<kj::_::PromiseNode,_kj::_::PromiseDisposer>::dispose
            ((Own<kj::_::PromiseNode,_kj::_::PromiseDisposer> *)&promise);
LAB_00381829:
  return (HttpClient *)p_Var13[2]._M_left;
}

Assistant:

HttpClient& getClient(kj::Url& parsed) {
    bool isHttps = parsed.scheme == "https";
    bool isHttp = parsed.scheme == "http";
    KJ_REQUIRE(isHttp || isHttps);

    auto& hosts = isHttps ? httpsHosts : httpHosts;

    // Look for a cached client for this host.
    // TODO(perf): It would be nice to recognize when different hosts have the same address and
    //   reuse the same connection pool, but:
    //   - We'd need a reliable way to compare NetworkAddresses, e.g. .equals() and .hashCode().
    //     It's very Java... ick.
    //   - Correctly handling TLS would be tricky: we'd need to verify that the new hostname is
    //     on the certificate. When SNI is in use we might have to request an additional
    //     certificate (is that possible?).
    auto iter = hosts.find(parsed.host);

    if (iter == hosts.end()) {
      // Need to open a new connection.
      kj::Network* networkToUse = &network;
      if (isHttps) {
        networkToUse = &KJ_REQUIRE_NONNULL(tlsNetwork, "this HttpClient doesn't support HTTPS");
      }

      auto promise = networkToUse->parseAddress(parsed.host, isHttps ? 443 : 80)
          .then([this](kj::Own<kj::NetworkAddress> addr) {
        return kj::heap<NetworkAddressHttpClient>(
            timer, responseHeaderTable, kj::mv(addr), settings);
      });

      Host host {
        kj::mv(parsed.host),
        kj::heap<PromiseNetworkAddressHttpClient>(kj::mv(promise))
      };
      kj::StringPtr nameRef = host.name;

      auto insertResult = hosts.insert(std::make_pair(nameRef, kj::mv(host)));
      KJ_ASSERT(insertResult.second);
      iter = insertResult.first;

      tasks.add(handleCleanup(hosts, iter));
    }

    return *iter->second.client;
  }